

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall leveldb::LookupKey::LookupKey(LookupKey *this,Slice *user_key,SequenceNumber s)

{
  size_t __n;
  char *pcVar1;
  
  __n = user_key->size_;
  if (__n + 0xd < 0xc9) {
    pcVar1 = this->space_;
  }
  else {
    pcVar1 = (char *)operator_new__(__n + 0xd);
  }
  this->start_ = pcVar1;
  pcVar1 = EncodeVarint32(pcVar1,(int)__n + 8);
  this->kstart_ = pcVar1;
  memcpy(pcVar1,user_key->data_,__n);
  *(SequenceNumber *)(pcVar1 + __n) = s * 0x100 + 1;
  this->end_ = (char *)((long)(pcVar1 + __n) + 8);
  return;
}

Assistant:

LookupKey::LookupKey(const Slice& user_key, SequenceNumber s) {
  size_t usize = user_key.size();
  size_t needed = usize + 13;  // A conservative estimate
  char* dst;
  if (needed <= sizeof(space_)) {
    dst = space_;
  } else {
    dst = new char[needed];
  }
  start_ = dst;
  dst = EncodeVarint32(dst, (uint32_t)usize + 8);
  kstart_ = dst;
  memcpy(dst, user_key.data(), usize);
  dst += usize;
  EncodeFixed64(dst, PackSequenceAndType(s, kValueTypeForSeek));
  dst += 8;
  end_ = dst;
}